

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O2

pcp_errno pcp_flow_send_msg(pcp_flow_t *flow,pcp_server_t *s)

{
  pcp_ctx_s *ctx;
  socklen_t addrlen;
  ssize_t sVar1;
  size_t len;
  sockaddr_in6 src_saddr;
  
  ctx = s->ctx;
  if (((flow->pcp_msg_buffer == (char *)0x0) || (flow->pcp_msg_len == 0)) &&
     (build_pcp_msg(flow), flow->pcp_msg_buffer == (char *)0x0)) {
    return PCP_ERR_SEND_FAILED;
  }
  pcp_fill_sockaddr((sockaddr *)&src_saddr,&(flow->kd).src_ip,0,1,s->pcp_scope_id);
  len = (size_t)flow->pcp_msg_len;
  do {
    if (len == 0) {
      pcp_logger(PCP_LOGLVL_INFO,"Sent PCP MSG (flow bucket:%d)",(ulong)flow->key_bucket);
      pcp_flow_clear_msg_buf(flow);
      return PCP_ERR_SUCCESS;
    }
    addrlen = 0x10;
    if ((s->pcp_server_saddr).ss_family == 10) {
      addrlen = 0x1c;
    }
    sVar1 = pcp_socket_sendto(ctx,flow->pcp_msg_buffer + (flow->pcp_msg_len - len),len,0x40,
                              &src_saddr,(sockaddr *)&s->pcp_server_saddr,addrlen);
    len = len - sVar1;
  } while (0 < sVar1);
  pcp_logger(PCP_LOGLVL_WARN,"Error occurred while sending PCP packet to server %s",
             s->pcp_server_paddr);
  return PCP_ERR_SEND_FAILED;
}

Assistant:

static pcp_errno pcp_flow_send_msg(pcp_flow_t *flow, pcp_server_t *s) {
    ssize_t ret;
    size_t to_send_count;
    pcp_ctx_t *ctx = s->ctx;
    struct sockaddr_in6 src_saddr;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if ((!flow->pcp_msg_buffer) || (flow->pcp_msg_len == 0)) {
        build_pcp_msg(flow);
        if (flow->pcp_msg_buffer == NULL) {
            PCP_LOG(PCP_LOGLVL_DEBUG, "Cannot build PCP MSG (flow bucket:%d)",
                    flow->key_bucket);
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_SEND_FAILED;
        }
    }

    pcp_fill_sockaddr((struct sockaddr *)&src_saddr, &flow->kd.src_ip, 0, 1,
                      s->pcp_scope_id);
    to_send_count = flow->pcp_msg_len;

    while (to_send_count != 0) {
        ret = flow->pcp_msg_len - to_send_count;

        ret = pcp_socket_sendto(
            ctx, flow->pcp_msg_buffer + ret, flow->pcp_msg_len - ret,
            MSG_DONTWAIT, &src_saddr, (struct sockaddr *)&s->pcp_server_saddr,
            SA_LEN((struct sockaddr *)&s->pcp_server_saddr));
        if (ret <= 0) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Error occurred while sending "
                    "PCP packet to server %s",
                    s->pcp_server_paddr);
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_SEND_FAILED;
        }
        to_send_count -= ret;
    }

    PCP_LOG(PCP_LOGLVL_INFO, "Sent PCP MSG (flow bucket:%d)", flow->key_bucket);

    pcp_flow_clear_msg_buf(flow);

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return PCP_ERR_SUCCESS;
}